

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O2

void __thiscall
entityx::EventManager::
emit<entityx::ComponentAddedEvent<____C_A_T_C_H____T_E_S_T____56()::Test>,entityx::Entity,entityx::ComponentHandle<____C_A_T_C_H____T_E_S_T____56()::Test,entityx::EntityManager>&>
          (EventManager *this,Entity *args,ComponentHandle<Test,_entityx::EntityManager> *args_1)

{
  int iVar1;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  *p_Var2;
  EventSignalPtr sig;
  ComponentAddedEvent<Test> event;
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  local_40;
  undefined **local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_28 = *(undefined4 *)&args->manager_;
  uStack_24 = *(undefined4 *)((long)&args->manager_ + 4);
  uStack_20 = (undefined4)(args->id_).id_;
  uStack_1c = *(undefined4 *)((long)&(args->id_).id_ + 4);
  local_18 = *(undefined4 *)&args_1->manager_;
  uStack_14 = *(undefined4 *)((long)&args_1->manager_ + 4);
  uStack_10 = (undefined4)(args_1->id_).id_;
  uStack_c = *(undefined4 *)((long)&(args_1->id_).id_ + 4);
  local_30 = &PTR__BaseEvent_0020b960;
  if (Event<entityx::ComponentAddedEvent<____C_A_T_C_H____T_E_S_T____56()::Test>>::family()::family
      == '\0') {
    iVar1 = __cxa_guard_acquire(&Event<entityx::ComponentAddedEvent<____C_A_T_C_H____T_E_S_T____56()::Test>>
                                 ::family()::family);
    if (iVar1 != 0) {
      Event<entityx::ComponentAddedEvent<____C_A_T_C_H____T_E_S_T____56()::Test>>::family()::family
           = BaseEvent::family_counter_;
      BaseEvent::family_counter_ = BaseEvent::family_counter_ + 1;
      __cxa_guard_release(&Event<entityx::ComponentAddedEvent<____C_A_T_C_H____T_E_S_T____56()::Test>>
                           ::family()::family);
    }
  }
  p_Var2 = &signal_for(this,Event<entityx::ComponentAddedEvent<____C_A_T_C_H____T_E_S_T____56()::Test>>
                            ::family()::family)->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
  Catch::clara::std::
  __shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_40,p_Var2);
  Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::emit
            (&(local_40._M_ptr)->
              super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,&local_30
            );
  Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40._M_refcount);
  entityx::BaseEvent::~BaseEvent((BaseEvent *)&local_30);
  return;
}

Assistant:

void emit(Args && ... args) {
    // Using 'E event(std::forward...)' causes VS to fail with an internal error. Hack around it.
    E event = E(std::forward<Args>(args) ...);
    auto sig = signal_for(std::size_t(Event<E>::family()));
    sig->emit(&event);
  }